

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_tests.cpp
# Opt level: O3

void __thiscall bech32_tests::bech32_testvectors_valid::test_method(bech32_testvectors_valid *this)

{
  string *str;
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long lVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  string recode;
  DecodeResult dec;
  char *in_stack_fffffffffffffe90;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  assertion_result local_120;
  char **local_108;
  assertion_result local_100;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  DecodeResult local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (test_method()::CASES_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&test_method()::CASES_abi_cxx11_);
    if (iVar1 != 0) {
      test_method()::CASES_abi_cxx11_[0]._M_dataplus._M_p =
           (pointer)&test_method()::CASES_abi_cxx11_[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)test_method()::CASES_abi_cxx11_,"A12UEL5L","");
      test_method()::CASES_abi_cxx11_[1]._M_dataplus._M_p =
           (pointer)&test_method()::CASES_abi_cxx11_[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(test_method()::CASES_abi_cxx11_ + 1),"a12uel5l","");
      test_method()::CASES_abi_cxx11_[2]._M_dataplus._M_p =
           (pointer)&test_method()::CASES_abi_cxx11_[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(test_method()::CASES_abi_cxx11_ + 2),
                 "an83characterlonghumanreadablepartthatcontainsthenumber1andtheexcludedcharactersbio1tt5tgs"
                 ,"");
      test_method()::CASES_abi_cxx11_[3]._M_dataplus._M_p =
           (pointer)&test_method()::CASES_abi_cxx11_[3].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(test_method()::CASES_abi_cxx11_ + 3),
                 "abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw","");
      test_method()::CASES_abi_cxx11_[4]._M_dataplus._M_p =
           (pointer)&test_method()::CASES_abi_cxx11_[4].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(test_method()::CASES_abi_cxx11_ + 4),
                 "11qqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqc8247j"
                 ,"");
      test_method()::CASES_abi_cxx11_[5]._M_dataplus._M_p =
           (pointer)&test_method()::CASES_abi_cxx11_[5].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(test_method()::CASES_abi_cxx11_ + 5),
                 "split1checkupstagehandshakeupstreamerranterredcaperred2y9e3w","");
      test_method()::CASES_abi_cxx11_[6]._M_dataplus._M_p =
           (pointer)&test_method()::CASES_abi_cxx11_[6].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(test_method()::CASES_abi_cxx11_ + 6),"?1ezyfcl","");
      __cxa_atexit(::__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&test_method()::CASES_abi_cxx11_);
    }
  }
  lVar4 = 0;
  do {
    str = (string *)((long)&test_method()::CASES_abi_cxx11_[0]._M_dataplus._M_p + lVar4);
    bech32::Decode(&local_78,str,BECH32);
    local_a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_a0 = "";
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x1c;
    file.m_begin = (iterator)&local_a8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
    local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(local_78.encoding == BECH32);
    local_120.m_message.px = (element_type *)0x0;
    local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100._0_8_ = "dec.encoding == bech32::Encoding::BECH32";
    local_100.m_message.px = (element_type *)0xe3ab00;
    local_98[8] = 0;
    local_98._0_8_ = &PTR__lazy_ostream_01389048;
    local_88._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_88._8_8_ = &local_100;
    local_c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_c0 = "";
    pvVar2 = (iterator)0x1;
    pvVar3 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_120,(lazy_ostream *)local_98,1,0,WARN,(check_type)in_stack_fffffffffffffe90,
               (size_t)&local_c8,0x1c);
    boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
    bech32::Encode((string *)local_98,BECH32,&local_78.hrp,&local_78.data);
    local_d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_d0 = "";
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x1e;
    file_00.m_begin = (iterator)&local_d8;
    msg_00.m_end = pvVar3;
    msg_00.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,
               msg_00);
    local_100.m_message.px = (element_type *)0x0;
    local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_130 = "!recode.empty()";
    local_128 = "";
    local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
    local_120._0_8_ = &PTR__lazy_ostream_01389048;
    local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_108 = &local_130;
    local_140 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_138 = "";
    pvVar2 = (iterator)0x1;
    pvVar3 = (iterator)0x0;
    local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)(CONCAT71(local_98._9_7_,local_98[8]) != 0);
    boost::test_tools::tt_detail::report_assertion
              (&local_100,(lazy_ostream *)&local_120,1,0,WARN,(check_type)in_stack_fffffffffffffe90,
               (size_t)&local_140,0x1e);
    boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
    local_150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    local_148 = "";
    local_160 = &boost::unit_test::basic_cstring<char_const>::null;
    local_158 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x1f;
    file_01.m_begin = (iterator)&local_150;
    msg_01.m_end = pvVar3;
    msg_01.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_160,
               msg_01);
    local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CaseInsensitiveEqual(str,(string *)local_98);
    local_100.m_message.px = (element_type *)0x0;
    local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_130 = "CaseInsensitiveEqual(str, recode)";
    local_128 = "";
    local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
    local_120._0_8_ = &PTR__lazy_ostream_01389048;
    local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_108 = &local_130;
    in_stack_fffffffffffffe90 =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bech32_tests.cpp"
    ;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_100,(lazy_ostream *)&local_120,1,0,WARN,0xe3a91d,
               (size_t)&stack0xfffffffffffffe90,0x1f);
    boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if (local_78.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.hrp._M_dataplus._M_p != &local_78.hrp.field_2) {
      operator_delete(local_78.hrp._M_dataplus._M_p,local_78.hrp.field_2._M_allocated_capacity + 1);
    }
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0xe0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bech32_testvectors_valid)
{
    static const std::string CASES[] = {
        "A12UEL5L",
        "a12uel5l",
        "an83characterlonghumanreadablepartthatcontainsthenumber1andtheexcludedcharactersbio1tt5tgs",
        "abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw",
        "11qqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqc8247j",
        "split1checkupstagehandshakeupstreamerranterredcaperred2y9e3w",
        "?1ezyfcl",
    };
    for (const std::string& str : CASES) {
        const auto dec = bech32::Decode(str);
        BOOST_CHECK(dec.encoding == bech32::Encoding::BECH32);
        std::string recode = bech32::Encode(bech32::Encoding::BECH32, dec.hrp, dec.data);
        BOOST_CHECK(!recode.empty());
        BOOST_CHECK(CaseInsensitiveEqual(str, recode));
    }
}